

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_square_brackets(void)

{
  bool bVar1;
  json *pjVar2;
  json o;
  json a;
  json local_68;
  
  argo::json::json(&a,array_e);
  argo::json::json(&o,10);
  argo::json::append(&a,&o);
  argo::json::~json(&o);
  argo::json::json(&o,20.0);
  argo::json::append(&a,&o);
  argo::json::~json(&o);
  argo::json::json(&o,"asdf");
  argo::json::append(&a,&o);
  argo::json::~json(&o);
  argo::json::json(&o,true);
  argo::json::append(&a,&o);
  argo::json::~json(&o);
  test_square_brackets_const_array(&a);
  pjVar2 = argo::json::operator[](&a,0);
  bVar1 = argo::json::operator!=(pjVar2,10);
  if (bVar1) {
LAB_0011020f:
    std::operator<<((ostream *)jlog,"FAIL: array access failed\n");
  }
  else {
    pjVar2 = argo::json::operator[](&a,1);
    bVar1 = argo::json::operator!=(pjVar2,20.0);
    if (bVar1) goto LAB_0011020f;
    pjVar2 = argo::json::operator[](&a,2);
    bVar1 = argo::json::operator!=(pjVar2,"asdf");
    if (bVar1) goto LAB_0011020f;
    pjVar2 = argo::json::operator[](&a,3);
    bVar1 = argo::json::operator_cast_to_bool(pjVar2);
    if (!bVar1) goto LAB_0011020f;
  }
  argo::json::json(&o,object_e);
  pjVar2 = argo::json::operator[](&o,"a");
  argo::json::json(&local_68);
  bVar1 = argo::json::operator!=(pjVar2,&local_68);
  argo::json::~json(&local_68);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: empty element isn\'t null - failed\n");
  }
  pjVar2 = argo::json::operator[](&o,"b");
  argo::json::operator=(pjVar2,1);
  pjVar2 = argo::json::operator[](&o,"c");
  argo::json::operator=(pjVar2,1.1);
  pjVar2 = argo::json::operator[](&o,"d");
  argo::json::operator=(pjVar2,"asdf");
  pjVar2 = argo::json::operator[](&o,"e");
  argo::json::operator=(pjVar2,true);
  test_square_brackets_const_object(&o);
  pjVar2 = argo::json::operator[](&o,"b");
  bVar1 = argo::json::operator!=(pjVar2,1);
  if (!bVar1) {
    pjVar2 = argo::json::operator[](&o,"c");
    bVar1 = argo::json::operator!=(pjVar2,1.1);
    if (!bVar1) {
      pjVar2 = argo::json::operator[](&o,"d");
      bVar1 = argo::json::operator!=(pjVar2,"asdf");
      if (!bVar1) {
        pjVar2 = argo::json::operator[](&o,"e");
        bVar1 = argo::json::operator_cast_to_bool(pjVar2);
        if (bVar1) goto LAB_00110389;
      }
    }
  }
  std::operator<<((ostream *)jlog,"FAIL: object access failed\n");
LAB_00110389:
  argo::json::~json(&o);
  argo::json::~json(&a);
  return;
}

Assistant:

void test_square_brackets()
{
    json a(json::array_e);
    a.append(10);
    a.append(20.0);
    a.append("asdf");
    a.append(true);

    test_square_brackets_const_array(a);

    if ((a[0] != 10) ||
        (a[1] != 20.0) ||
        (a[2] != "asdf") ||
         !a[3])
    {
        jlog << "FAIL: array access failed\n";
    }

    json o(json::object_e);
    if (o["a"] != json())
    {
        jlog << "FAIL: empty element isn't null - failed\n";
    }
    o["b"] = 1;
    o["c"] = 1.1;
    o["d"] = "asdf";
    o["e"] = true;

    test_square_brackets_const_object(o);

    if ((o["b"] != 1) ||
        (o["c"] != 1.1) ||
        (o["d"] != "asdf") ||
        !o["e"])
    {
        jlog << "FAIL: object access failed\n";
    }
}